

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

void __thiscall adios2::core::Engine::RemoveCreatedVars(Engine *this)

{
  bool bVar1;
  _Node_iterator<const_adios2::core::VariableBase_*,_true,_false> *in_RDI;
  VariableBase **VarRec;
  iterator __end2;
  iterator __begin2;
  unordered_set<const_adios2::core::VariableBase_*,_std::hash<const_adios2::core::VariableBase_*>,_std::equal_to<const_adios2::core::VariableBase_*>,_std::allocator<const_adios2::core::VariableBase_*>_>
  *__range2;
  unordered_set<const_adios2::core::VariableBase_*,_std::hash<const_adios2::core::VariableBase_*>,_std::equal_to<const_adios2::core::VariableBase_*>,_std::allocator<const_adios2::core::VariableBase_*>_>
  *in_stack_ffffffffffffffc8;
  _Node_iterator_base<const_adios2::core::VariableBase_*,_false> local_20;
  _Node_iterator_base<const_adios2::core::VariableBase_*,_false> local_18;
  _Node_iterator<const_adios2::core::VariableBase_*,_true,_false> *local_10;
  
  local_10 = in_RDI + 0x11;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_set<const_adios2::core::VariableBase_*,_std::hash<const_adios2::core::VariableBase_*>,_std::equal_to<const_adios2::core::VariableBase_*>,_std::allocator<const_adios2::core::VariableBase_*>_>
       ::begin(in_stack_ffffffffffffffc8);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_set<const_adios2::core::VariableBase_*,_std::hash<const_adios2::core::VariableBase_*>,_std::equal_to<const_adios2::core::VariableBase_*>,_std::allocator<const_adios2::core::VariableBase_*>_>
       ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    std::__detail::_Node_iterator<const_adios2::core::VariableBase_*,_true,_false>::operator*
              ((_Node_iterator<const_adios2::core::VariableBase_*,_true,_false> *)0x84fe3b);
    IO::RemoveVariable((IO *)__begin2.
                             super__Node_iterator_base<const_adios2::core::VariableBase_*,_false>.
                             _M_cur,
                       (string *)
                       __end2.super__Node_iterator_base<const_adios2::core::VariableBase_*,_false>.
                       _M_cur);
    std::__detail::_Node_iterator<const_adios2::core::VariableBase_*,_true,_false>::operator++
              (in_RDI);
  }
  std::
  unordered_set<const_adios2::core::VariableBase_*,_std::hash<const_adios2::core::VariableBase_*>,_std::equal_to<const_adios2::core::VariableBase_*>,_std::allocator<const_adios2::core::VariableBase_*>_>
  ::clear((unordered_set<const_adios2::core::VariableBase_*,_std::hash<const_adios2::core::VariableBase_*>,_std::equal_to<const_adios2::core::VariableBase_*>,_std::allocator<const_adios2::core::VariableBase_*>_>
           *)0x84fe7a);
  return;
}

Assistant:

void Engine::RemoveCreatedVars()
{
    for (auto &VarRec : m_CreatedVars)
    {
        m_IO.RemoveVariable(VarRec->m_Name);
    }
    m_CreatedVars.clear();
}